

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventHandler.cpp
# Opt level: O2

void __thiscall TgBot::EventHandler::handleMessage(EventHandler *this,Ptr *message)

{
  EventBroadcaster *pEVar1;
  element_type *peVar2;
  bool bVar3;
  allocator local_a9;
  string command;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_88;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  pEVar1 = this->_broadcaster;
  std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_58,&message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>);
  EventBroadcaster::broadcastAnyMessage(pEVar1,(Ptr *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  peVar2 = (message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string((string *)&command,"/",&local_a9);
  bVar3 = StringTools::startsWith(&peVar2->text,&command);
  std::__cxx11::string::~string((string *)&command);
  if (bVar3) {
    std::__cxx11::string::find
              ((char)(message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + -0x48,0x20);
    std::__cxx11::string::find
              ((char)(message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + -0x48,0x40);
    std::__cxx11::string::substr
              ((ulong)&command,
               (ulong)&((message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->text);
    pEVar1 = this->_broadcaster;
    std::__cxx11::string::string((string *)&local_48,(string *)&command);
    std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,&message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>);
    bVar3 = EventBroadcaster::broadcastCommand(pEVar1,&local_48,(Ptr *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
    if (!bVar3) {
      pEVar1 = this->_broadcaster;
      std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,&message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>)
      ;
      EventBroadcaster::broadcastUnknownCommand(pEVar1,(Ptr *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
    }
    std::__cxx11::string::~string((string *)&command);
  }
  else {
    pEVar1 = this->_broadcaster;
    std::__shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_88,&message->super___shared_ptr<TgBot::Message,_(__gnu_cxx::_Lock_policy)2>);
    EventBroadcaster::broadcastNonCommandMessage(pEVar1,(Ptr *)&local_88);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  }
  return;
}

Assistant:

void EventHandler::handleMessage(Message::Ptr message) const {
    _broadcaster.broadcastAnyMessage(message);

    if (StringTools::startsWith(message->text, "/")) {
        size_t splitPosition;
        size_t spacePosition = message->text.find(' ');
        size_t atSymbolPosition = message->text.find('@');
        if (spacePosition == string::npos) {
            if (atSymbolPosition == string::npos) {
                splitPosition = message->text.size();
            } else {
                splitPosition = atSymbolPosition;
            }
        } else if (atSymbolPosition == string::npos) {
            splitPosition = spacePosition;
        } else {
            splitPosition = std::min(spacePosition, atSymbolPosition);
        }
        std::string command = message->text.substr(1, splitPosition - 1);
        if (!_broadcaster.broadcastCommand(command, message)) {
            _broadcaster.broadcastUnknownCommand(message);
        }
    } else {
        _broadcaster.broadcastNonCommandMessage(message);
    }
}